

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

chunk_conflict * moria_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  _Bool quest;
  ushort uVar1;
  short sVar2;
  room_profile *prVar3;
  ulong uVar4;
  room_profile profile;
  _Bool _Var5;
  int16_t iVar6;
  uint32_t uVar7;
  uint uVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  uint32_t uVar11;
  chunk *c;
  _Bool **pp_Var12;
  _Bool *p_Var13;
  undefined1 (*pauVar14) [12];
  char *pcVar15;
  dun_data *pdVar16;
  cave_profile *pcVar17;
  ulong uVar18;
  ulong uVar19;
  wchar_t wVar20;
  int iVar21;
  wchar_t wVar22;
  long lVar23;
  
  uVar7 = Rand_div(10);
  if (dun->quest == false) {
    uVar8 = (int)(p->depth / 0x18) + uVar7 + 1;
    if ((int)uVar8 < 2) {
      iVar21 = 0x46;
    }
    else if (uVar8 == 2) {
      iVar21 = 0x4b;
    }
    else if (uVar8 < 4) {
      iVar21 = 0x50;
    }
    else if (uVar8 == 4) {
      iVar21 = 0x55;
    }
    else {
      iVar21 = (uint)(5 < uVar8) * 5 + 0x5a;
    }
  }
  else {
    iVar21 = 0x5f;
  }
  uVar1 = z_info->dungeon_hgt;
  uVar7 = Rand_div(10);
  wVar20 = (int)((uVar7 + iVar21) * (uint)uVar1) / 100;
  uVar1 = z_info->dungeon_wid;
  uVar7 = Rand_div(10);
  pdVar16 = dun;
  wVar9 = (int)((uVar7 + iVar21) * (uint)uVar1) / 100;
  if (min_height < wVar20) {
    min_height = wVar20;
  }
  if ((int)(uint)z_info->dungeon_hgt <= min_height) {
    min_height = (uint)z_info->dungeon_hgt;
  }
  if (min_width < wVar9) {
    min_width = wVar9;
  }
  if ((int)(uint)z_info->dungeon_wid <= min_width) {
    min_width = (uint)z_info->dungeon_wid;
  }
  pcVar17 = dun->profile;
  wVar9 = pcVar17->block_size;
  dun->block_hgt = wVar9;
  pdVar16->block_wid = wVar9;
  sVar2 = p->depth;
  _Var5 = pdVar16->persist;
  wVar9 = pcVar17->dun_unusual;
  wVar20 = pcVar17->n_room_profiles;
  c = (chunk *)cave_new(min_height,min_width);
  c->depth = (int)sVar2;
  wVar10 = c->height;
  wVar22 = c->width;
  uVar4 = (long)(wVar22 * wVar10) / 7;
  if ((player->opts).opt[0x18] == true) {
    msg("height=%d  width=%d  nfloors=%d",(ulong)(uint)wVar10,(ulong)(uint)wVar22,uVar4 & 0xffffffff
       );
    wVar10 = c->height;
    wVar22 = c->width;
  }
  fill_rectangle(c,L'\0',L'\0',wVar10 + L'\xffffffff',wVar22 + L'\xffffffff',L'\x15',L'\0');
  draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x16',L'\0',true
                );
  pdVar16 = dun;
  wVar10 = c->height / dun->block_hgt;
  dun->row_blocks = wVar10;
  pdVar16->col_blocks = c->width / pdVar16->block_wid;
  pp_Var12 = (_Bool **)mem_zalloc((long)wVar10 << 3);
  pdVar16 = dun;
  dun->room_map = pp_Var12;
  for (lVar23 = 0; lVar23 < pdVar16->row_blocks; lVar23 = lVar23 + 1) {
    p_Var13 = (_Bool *)mem_zalloc((long)pdVar16->col_blocks);
    dun->room_map[lVar23] = p_Var13;
    pdVar16 = dun;
  }
  pdVar16->pit_num = L'\0';
  pdVar16->cent_n = L'\0';
  reset_entrance_data((chunk_conflict *)c);
  if (_Var5 != false) {
    build_staircase_rooms((chunk_conflict *)c,"Moria Generation");
  }
  uVar18 = 0;
  uVar19 = (ulong)(uint)wVar20;
  if (wVar20 < L'\x01') {
    uVar19 = uVar18;
  }
  do {
    if (((int)uVar4 <= c->feat_count[1]) && (L'\x01' < dun->cent_n)) {
      for (lVar23 = 0; lVar23 < dun->row_blocks; lVar23 = lVar23 + 1) {
        mem_free(dun->room_map[lVar23]);
      }
      mem_free(dun->room_map);
      do_traditional_tunneling((chunk_conflict *)c);
      ensure_connectedness((chunk_conflict *)c,true);
      draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x15',L'\0',
                     true);
      draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x16',L'\0',
                     true);
      for (wVar9 = L'\0'; pcVar17 = dun->profile, wVar9 < (pcVar17->str).mag;
          wVar9 = wVar9 + L'\x01') {
        build_streamer((chunk_conflict *)c,L'\x11',(pcVar17->str).mc);
      }
      for (wVar9 = L'\0'; wVar9 < (pcVar17->str).qua; wVar9 = wVar9 + L'\x01') {
        build_streamer((chunk_conflict *)c,L'\x12',(pcVar17->str).qc);
        pcVar17 = dun->profile;
      }
      _Var5 = dun->persist;
      quest = dun->quest;
      wVar9 = rand_range(3,4);
      wVar20 = rand_range(1,2);
      handle_level_stairs((chunk_conflict *)c,_Var5,quest,wVar9,wVar20);
      wVar9 = c->depth;
      uVar7 = (uint)(L'\x05' < wVar9) * 8 + 2;
      if (0xffffffe4 < (uint)(wVar9 + L'\xffffffdf')) {
        uVar7 = wVar9 / 3;
      }
      uVar11 = Rand_div(uVar7);
      alloc_objects((chunk_conflict *)c,L'\x01',L'\0',uVar11 + L'\x01',c->depth,'\0');
      uVar11 = Rand_div(uVar7);
      alloc_objects((chunk_conflict *)c,L'\x01',L'\x01',(int)(uVar11 + 1) / 5,c->depth,'\0');
      _Var5 = new_player_spot((chunk_conflict *)c,p);
      if (_Var5) {
        uVar1 = z_info->level_monster_min;
        uVar11 = Rand_div(8);
        mon_restrict("Moria dwellers",c->depth,c->depth,true);
        for (iVar21 = (uint)uVar1 + uVar7 + uVar11 + 1; wVar9 = c->depth, 0 < iVar21;
            iVar21 = iVar21 + -1) {
          pick_and_place_distant_monster(c,p->grid,L'\0',true,wVar9);
        }
        mon_restrict((char *)0x0,wVar9,wVar9,false);
        iVar6 = Rand_normal((uint)z_info->room_item_av,3);
        alloc_objects((chunk_conflict *)c,L'\x02',L'\x03',(int)iVar6,c->depth,'\x01');
        iVar6 = Rand_normal((uint)z_info->both_item_av,3);
        alloc_objects((chunk_conflict *)c,L'\x03',L'\x03',(int)iVar6,c->depth,'\x01');
        iVar6 = Rand_normal((uint)z_info->both_gold_av,3);
        alloc_objects((chunk_conflict *)c,L'\x03',L'\x02',(int)iVar6,c->depth,'\x01');
        return (chunk_conflict *)c;
      }
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      pcVar15 = "could not place player";
      goto LAB_00147f5c;
    }
    if ((int)uVar18 == 0x1f5) {
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      pcVar15 = "moria chunk could not be created";
LAB_00147f5c:
      *p_error = pcVar15;
      return (chunk_conflict *)0x0;
    }
    uVar18 = (ulong)((int)uVar18 + 1);
    uVar7 = Rand_div(100);
    wVar20 = L'\0';
    for (wVar10 = L'\0'; (wVar20 == wVar10 && (wVar10 < dun->profile->max_rarity));
        wVar10 = (uint)((int)uVar11 < c->depth / 2 + 0x32) + wVar10) {
      uVar11 = Rand_div(wVar9);
      wVar20 = wVar10 + L'\x01';
    }
    for (lVar23 = 0; uVar19 * 0x38 - lVar23 != 0; lVar23 = lVar23 + 0x38) {
      prVar3 = dun->profile->room_profiles;
      if ((*(wchar_t *)((long)&prVar3->rarity + lVar23) <= wVar10) &&
         ((int)uVar7 < *(int *)((long)&prVar3->cutoff + lVar23))) {
        pauVar14 = (undefined1 (*) [12])((long)&prVar3->next + lVar23);
        profile.name._4_4_ = (int)((ulong)*(undefined8 *)(*pauVar14 + 8) >> 0x20);
        profile._0_12_ = *pauVar14;
        profile.builder = (room_builder_conflict)*(undefined8 *)(pauVar14[1] + 4);
        profile.rating = *(wchar_t *)((long)(pauVar14 + 2) + 0);
        profile.height = *(wchar_t *)((long)(pauVar14 + 2) + 4);
        profile._32_8_ = *(undefined8 *)(pauVar14[2] + 8);
        profile._40_8_ = *(undefined8 *)(pauVar14[3] + 4);
        profile._48_8_ = *(undefined8 *)pauVar14[4];
        _Var5 = room_build(c,L'\0',L'\0',profile,true);
        if (_Var5) break;
      }
    }
  } while( true );
}

Assistant:

struct chunk *moria_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, k;
	int size_percent, y_size, x_size;
	struct chunk *c;

	/* Scale the level */
	i = randint1(10) + p->depth / 24;
	if (dun->quest) size_percent = 100;
	else if (i < 2) size_percent = 75;
	else if (i < 3) size_percent = 80;
	else if (i < 4) size_percent = 85;
	else if (i < 5) size_percent = 90;
	else if (i < 6) size_percent = 95;
	else size_percent = 100;
	y_size = z_info->dungeon_hgt * (size_percent - 5 + randint0(10)) / 100;
	x_size = z_info->dungeon_wid * (size_percent - 5 + randint0(10)) / 100;

	/* Enforce dimension limits */
	y_size = MIN(MAX(y_size, min_height), z_info->dungeon_hgt);
	x_size = MIN(MAX(x_size, min_width), z_info->dungeon_wid);

	/* Set the block height and width */
	dun->block_hgt = dun->profile->block_size;
	dun->block_wid = dun->profile->block_size;

	c = moria_chunk(p, p->depth, MIN(z_info->dungeon_hgt, y_size),
		MIN(z_info->dungeon_wid, x_size), dun->persist);
	if (!c) {
		*p_error = "moria chunk could not be created";
		return NULL;
	}

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_PERM, SQUARE_NONE, true);

	/* Add some magma streamers */
	for (i = 0; i < dun->profile->str.mag; i++)
		build_streamer(c, FEAT_MAGMA, dun->profile->str.mc);

	/* Add some quartz streamers */
	for (i = 0; i < dun->profile->str.qua; i++)
		build_streamer(c, FEAT_QUARTZ, dun->profile->str.qc);

	/* Place 3 or 4 down stairs and 1 or 2 up stairs near some walls */
	handle_level_stairs(c, dun->persist, dun->quest,
		rand_range(3, 4), rand_range(1, 2));

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(c->depth / 3, 10), 2);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon, reduce frequency by factor of 5 */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k)/5, c->depth, 0);

	/* Determine the character location */
	if (!new_player_spot(c, p)) {
		uncreate_artifacts(c);
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "could not place player";
		return NULL;
	}

	/* Pick a base number of monsters */
	i = z_info->level_monster_min + randint1(8) + k;

	/* Moria levels have a high proportion of cave dwellers. */
	mon_restrict("Moria dwellers", c->depth, c->depth, true);

	/* Put some monsters in the dungeon */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(c, p->grid, 0, true, c->depth);
	}

	/* Remove our restrictions. */
	(void) mon_restrict(NULL, c->depth, c->depth, false);

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}